

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EngineInterfaceObject.cpp
# Opt level: O1

bool Js::EngineInterfaceObject::InitializeCommonNativeInterfaces
               (DynamicObject *commonNativeInterfaces,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  
  DeferredTypeHandlerBase::Convert(typeHandler,commonNativeInterfaces,mode,0x3f,0);
  this = (((((((commonNativeInterfaces->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
           super_JavascriptLibraryBase).scriptContext.ptr)->super_ScriptContextBase).
         javascriptLibrary;
  (*(commonNativeInterfaces->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x17])
            (commonNativeInterfaces,0x58,(this->super_JavascriptLibraryBase).booleanConstructor.ptr,
             0,0);
  (*(commonNativeInterfaces->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x17])
            (commonNativeInterfaces,0x111,(this->super_JavascriptLibraryBase).objectConstructor.ptr,
             0,0);
  (*(commonNativeInterfaces->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x17])
            (commonNativeInterfaces,0x10b,(this->super_JavascriptLibraryBase).numberConstructor.ptr,
             0,0);
  (*(commonNativeInterfaces->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x17])
            (commonNativeInterfaces,0x139,(this->super_JavascriptLibraryBase).regexConstructor.ptr,0
             ,0);
  (*(commonNativeInterfaces->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x17])
            (commonNativeInterfaces,0x15c,(this->super_JavascriptLibraryBase).stringConstructor.ptr,
             0,0);
  (*(commonNativeInterfaces->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x17])
            (commonNativeInterfaces,0x6b,(this->super_JavascriptLibraryBase).dateConstructor.ptr,0,0
            );
  (*(commonNativeInterfaces->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x17])
            (commonNativeInterfaces,0x7f,(this->super_JavascriptLibraryBase).errorConstructor.ptr,0,
             0);
  (*(commonNativeInterfaces->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x17])
            (commonNativeInterfaces,0xd6,(this->super_JavascriptLibraryBase).mapConstructor.ptr,0,0)
  ;
  (*(commonNativeInterfaces->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x17])
            (commonNativeInterfaces,0x166,(this->super_JavascriptLibraryBase).symbolConstructor.ptr,
             0,0);
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x28c,(FunctionInfo *)Math::EntryInfo::Abs,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x28d,(FunctionInfo *)Math::EntryInfo::Floor,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x28e,(FunctionInfo *)Math::EntryInfo::Pow,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x28f,
             (FunctionInfo *)JavascriptObject::EntryInfo::DefineProperty,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x290,
             (FunctionInfo *)JavascriptObject::EntryInfo::GetPrototypeOf,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x291,
             (FunctionInfo *)JavascriptObject::EntryInfo::IsExtensible,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x292,
             (FunctionInfo *)JavascriptObject::EntryInfo::GetOwnPropertyNames,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x293,
             (FunctionInfo *)JavascriptObject::EntryInfo::HasOwnProperty,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x294,(FunctionInfo *)JavascriptObject::EntryInfo::Keys,1,
             '\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x295,(FunctionInfo *)JavascriptObject::EntryInfo::Create,1
             ,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x296,
             (FunctionInfo *)JavascriptObject::EntryInfo::GetOwnPropertyDescriptor,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x297,
             (FunctionInfo *)JavascriptObject::EntryInfo::PreventExtensions,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x298,(FunctionInfo *)JavascriptArray::EntryInfo::Join,1,
             '\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x299,(FunctionInfo *)JavascriptArray::EntryInfo::Map,1,
             '\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x29a,(FunctionInfo *)JavascriptArray::EntryInfo::Slice,1,
             '\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x29b,(FunctionInfo *)JavascriptArray::EntryInfo::Concat,1,
             '\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x29c,(FunctionInfo *)JavascriptFunction::EntryInfo::Bind,1
             ,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x29d,(FunctionInfo *)JavascriptFunction::EntryInfo::Apply,
             1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x29e,(FunctionInfo *)JavascriptDate::EntryInfo::GetDate,1,
             '\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x29f,(FunctionInfo *)JavascriptDate::EntryInfo::Now,1,
             '\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x2a0,(FunctionInfo *)JavascriptString::EntryInfo::Replace,
             1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x2a1,
             (FunctionInfo *)JavascriptString::EntryInfo::ToLowerCase,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x2a2,
             (FunctionInfo *)JavascriptString::EntryInfo::ToUpperCase,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x2a3,(FunctionInfo *)JavascriptString::EntryInfo::Split,1,
             '\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x2a4,
             (FunctionInfo *)JavascriptString::EntryInfo::Substring,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x2a5,(FunctionInfo *)JavascriptString::EntryInfo::Repeat,1
             ,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x2a6,(FunctionInfo *)JavascriptString::EntryInfo::IndexOf,
             1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x2a7,(FunctionInfo *)GlobalObject::EntryInfo::IsFinite,1,
             '\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x2a8,(FunctionInfo *)GlobalObject::EntryInfo::IsNaN,1,
             '\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x2a9,(FunctionInfo *)GlobalObject::EntryInfo::Eval,1,
             '\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x2aa,(FunctionInfo *)EntryInfo::BuiltIn_raiseNeedObject,1,
             '\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x2ab,
             (FunctionInfo *)EntryInfo::BuiltIn_raiseObjectIsAlreadyInitialized,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x2ac,
             (FunctionInfo *)EntryInfo::BuiltIn_raiseOptionValueOutOfRange_3,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x2ad,
             (FunctionInfo *)EntryInfo::BuiltIn_raiseOptionValueOutOfRange,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x2ae,
             (FunctionInfo *)EntryInfo::BuiltIn_raiseNeedObjectOrString,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x2af,
             (FunctionInfo *)EntryInfo::BuiltIn_raiseLocaleNotWellFormed,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x2b0,
             (FunctionInfo *)EntryInfo::BuiltIn_raiseThis_NullOrUndefined,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x2b1,
             (FunctionInfo *)EntryInfo::BuiltIn_raiseNotAConstructor,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x2b2,
             (FunctionInfo *)EntryInfo::BuiltIn_raiseObjectIsNonExtensible,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x2b3,
             (FunctionInfo *)EntryInfo::BuiltIn_raiseLengthIsTooBig,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x2b4,
             (FunctionInfo *)EntryInfo::BuiltIn_raiseNonObjectFromIterable,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x2b5,
             (FunctionInfo *)EntryInfo::BuiltIn_raiseEmptyArrayAndInitValueNotPresent,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x2b6,
             (FunctionInfo *)EntryInfo::BuiltIn_raiseNeedObjectOfType,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x2b7,
             (FunctionInfo *)EntryInfo::BuiltIn_raiseInvalidCurrencyCode,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x2b8,
             (FunctionInfo *)EntryInfo::BuiltIn_raiseMissingCurrencyCode,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x2b9,(FunctionInfo *)EntryInfo::BuiltIn_raiseInvalidDate,1
             ,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x2ba,
             (FunctionInfo *)EntryInfo::BuiltIn_raiseFunctionArgument_NeedFunction,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,699,(FunctionInfo *)EntryInfo::GetErrorMessage,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,700,(FunctionInfo *)EntryInfo::LogDebugMessage,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x2bd,(FunctionInfo *)EntryInfo::TagPublicLibraryCode,1,
             '\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x2be,(FunctionInfo *)EntryInfo::SetPrototype,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x2bf,(FunctionInfo *)EntryInfo::GetArrayLength,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x2c0,(FunctionInfo *)EntryInfo::RegexMatch,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,commonNativeInterfaces,0x28b,(FunctionInfo *)EntryInfo::CallInstanceFunction,1,
             '\x06');
  DynamicObject::SetHasNoEnumerableProperties(commonNativeInterfaces,true);
  return true;
}

Assistant:

bool EngineInterfaceObject::InitializeCommonNativeInterfaces(DynamicObject* commonNativeInterfaces, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        // start with 1 for CallInstanceFunction
        int initSlotCapacity = 1;

#define GlobalMathBuiltIn(mathMethod) initSlotCapacity++;
#define GlobalBuiltIn(global, method) initSlotCapacity++;
#define GlobalBuiltInConstructor(global) initSlotCapacity++;
#define BuiltInRaiseException(exceptionType, exceptionID) initSlotCapacity++;
#define EngineInterfaceBuiltIn2(propId, nativeMethod) initSlotCapacity++;
#include "EngineInterfaceObjectBuiltIns.h"

        typeHandler->Convert(commonNativeInterfaces, mode, initSlotCapacity);

        JavascriptLibrary* library = commonNativeInterfaces->GetScriptContext()->GetLibrary();

#define GlobalMathBuiltIn(mathMethod) library->AddFunctionToLibraryObject(commonNativeInterfaces, PropertyIds::builtInMath##mathMethod, &Math::EntryInfo::mathMethod, 1);
#define GlobalBuiltIn(global, method) library->AddFunctionToLibraryObject(commonNativeInterfaces, PropertyIds::builtIn##global##Entry##method, &global::EntryInfo::method, 1);
#define GlobalBuiltInConstructor(global) SetPropertyOn(commonNativeInterfaces, PropertyIds::##global##, library->Get##global##Constructor());
#define BuiltInRaiseException(exceptionType, exceptionID) library->AddFunctionToLibraryObject(commonNativeInterfaces, PropertyIds::raise##exceptionID, &EngineInterfaceObject::EntryInfo::BuiltIn_raise##exceptionID, 1);
#define EngineInterfaceBuiltIn2(propId, nativeMethod) library->AddFunctionToLibraryObject(commonNativeInterfaces, PropertyIds::propId, &EngineInterfaceObject::EntryInfo::nativeMethod, 1);
#include "EngineInterfaceObjectBuiltIns.h"

        library->AddFunctionToLibraryObject(commonNativeInterfaces, PropertyIds::builtInCallInstanceFunction, &EngineInterfaceObject::EntryInfo::CallInstanceFunction, 1);

        commonNativeInterfaces->SetHasNoEnumerableProperties(true);

        return true;
    }